

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

void Ssw_ClassesPrint(Ssw_Cla_t *p,int fVeryVerbose)

{
  uint uVar1;
  undefined8 uVar2;
  Aig_Obj_t **ppAVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pObj_00;
  uint local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppClass;
  int fVeryVerbose_local;
  Ssw_Cla_t *p_local;
  
  Abc_Print(1,"Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",(ulong)(uint)p->nCands1,
            (ulong)(uint)p->nClasses,(ulong)(uint)(p->nCands1 + p->nLits));
  if (fVeryVerbose != 0) {
    Abc_Print(1,"Constants { ");
    for (local_2c = 0; iVar4 = Vec_PtrSize(p->pAig->vObjs), (int)local_2c < iVar4;
        local_2c = local_2c + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_2c);
      if ((pObj_00 != (Aig_Obj_t *)0x0) &&
         (iVar4 = Ssw_ObjIsConst1Cand(p->pAig,pObj_00), iVar4 != 0)) {
        uVar1 = pObj_00->Id;
        uVar2 = *(undefined8 *)&pObj_00->field_0x18;
        uVar5 = Aig_SupportSize(p->pAig,pObj_00);
        uVar6 = Aig_NodeMffcSupp(p->pAig,pObj_00,0,(Vec_Ptr_t *)0x0);
        Abc_Print(1,"%d(%d,%d,%d) ",(ulong)uVar1,(ulong)((uint)((ulong)uVar2 >> 0x20) & 0xffffff),
                  (ulong)uVar5,(ulong)uVar6);
      }
    }
    Abc_Print(1,"}\n");
    for (local_2c = 0; iVar4 = Aig_ManObjNumMax(p->pAig), (int)local_2c < iVar4;
        local_2c = local_2c + 1) {
      ppAVar3 = p->pId2Class[(int)local_2c];
      if (ppAVar3 != (Aig_Obj_t **)0x0) {
        Abc_Print(1,"%3d (%3d) : ",(ulong)local_2c,(ulong)(uint)p->pClassSizes[(int)local_2c]);
        Ssw_ClassesPrintOne(p,*ppAVar3);
      }
    }
    Abc_Print(1,"\n");
  }
  return;
}

Assistant:

void Ssw_ClassesPrint( Ssw_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** ppClass;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",
        p->nCands1, p->nClasses, p->nCands1+p->nLits );
    if ( !fVeryVerbose )
        return;
    Abc_Print( 1, "Constants { " );
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Abc_Print( 1, "%d(%d,%d,%d) ", pObj->Id, pObj->Level,
            Aig_SupportSize(p->pAig,pObj), Aig_NodeMffcSupp(p->pAig,pObj,0,NULL) );
    Abc_Print( 1, "}\n" );
    Ssw_ManForEachClass( p, ppClass, i )
    {
        Abc_Print( 1, "%3d (%3d) : ", i, p->pClassSizes[i] );
        Ssw_ClassesPrintOne( p, ppClass[0] );
    }
    Abc_Print( 1, "\n" );
}